

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unifiedcache.cpp
# Opt level: O2

void __thiscall icu_63::UnifiedCache::handleUnreferencedObject(UnifiedCache *this)

{
  Mutex lock;
  Mutex local_10;
  
  local_10.fMutex = &gCacheMutex;
  umtx_lock_63(&gCacheMutex);
  this->fNumValuesInUse = this->fNumValuesInUse + -1;
  _runEvictionSlice(this);
  Mutex::~Mutex(&local_10);
  return;
}

Assistant:

void UnifiedCache::handleUnreferencedObject() const {
    Mutex lock(&gCacheMutex);
    --fNumValuesInUse;
    _runEvictionSlice();
}